

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_writer.cpp
# Opt level: O0

void __thiscall embree::XMLWriter::store(XMLWriter *this,AmbientLight *light,ssize_t id)

{
  int __oflag;
  XMLWriter *in_RDI;
  Vec3fa *in_stack_ffffffffffffff70;
  allocator *paVar1;
  XMLWriter *this_00;
  allocator local_71;
  string local_70 [55];
  undefined1 local_39 [57];
  
  this_00 = (XMLWriter *)local_39;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_39 + 1),"AmbientLight",(allocator *)this_00);
  open(in_RDI,local_39 + 1,__oflag);
  std::__cxx11::string::~string((string *)(local_39 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_39);
  store(this_00,(char *)in_RDI,in_stack_ffffffffffffff70);
  paVar1 = &local_71;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_70,"AmbientLight",paVar1);
  close(in_RDI,(int)local_70);
  std::__cxx11::string::~string(local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  return;
}

Assistant:

void XMLWriter::store(const SceneGraph::AmbientLight& light, ssize_t id)
  {
    open("AmbientLight");
    store("L",light.L);
    close("AmbientLight");
  }